

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImageFilledPolygon(gdImagePtr im,gdPointPtr p,int n,int c)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  int local_5c;
  int local_58;
  int fill_color;
  int ints;
  int ind2;
  int ind1;
  int y2;
  int x2;
  int y1;
  int x1;
  int pmaxy;
  int maxy;
  int miny;
  int y;
  int index;
  int j;
  int i;
  int c_local;
  int n_local;
  gdPointPtr p_local;
  gdImagePtr im_local;
  
  if (n < 1) {
    return;
  }
  local_5c = c;
  if (c == -7) {
    local_5c = im->AA_color;
  }
  if (im->polyAllocated == 0) {
    iVar3 = overflow2(4,n);
    if (iVar3 != 0) {
      return;
    }
    piVar4 = (int *)gdMalloc((long)n << 2);
    im->polyInts = piVar4;
    if (im->polyInts == (int *)0x0) {
      return;
    }
    im->polyAllocated = n;
  }
  if (im->polyAllocated < n) {
    while (im->polyAllocated < n) {
      im->polyAllocated = im->polyAllocated << 1;
    }
    iVar3 = overflow2(4,im->polyAllocated);
    if (iVar3 != 0) {
      return;
    }
    piVar4 = (int *)gdReallocEx(im->polyInts,(long)im->polyAllocated << 2);
    im->polyInts = piVar4;
    if (im->polyInts == (int *)0x0) {
      return;
    }
  }
  pmaxy = p->y;
  x1 = p->y;
  for (index = 1; iVar3 = x1, index < n; index = index + 1) {
    if (p[index].y < pmaxy) {
      pmaxy = p[index].y;
    }
    if (x1 < p[index].y) {
      x1 = p[index].y;
    }
  }
  if ((n < 2) || (pmaxy != x1)) {
    if (pmaxy < im->cy1) {
      pmaxy = im->cy1;
    }
    if (im->cy2 < x1) {
      x1 = im->cy2;
    }
    for (maxy = pmaxy; maxy <= x1; maxy = maxy + 1) {
      local_58 = 0;
      for (index = 0; index < n; index = index + 1) {
        if (index == 0) {
          ints = n + -1;
          fill_color = 0;
        }
        else {
          ints = index + -1;
          fill_color = index;
        }
        y2 = p[ints].y;
        ind2 = p[fill_color].y;
        if (y2 < ind2) {
          x2 = p[ints].x;
          ind1 = p[fill_color].x;
LAB_0010f7b0:
          if ((maxy < y2) || (ind2 <= maxy)) {
            if ((maxy == iVar3) && (maxy == ind2)) {
              im->polyInts[local_58] = ind1;
              local_58 = local_58 + 1;
            }
          }
          else {
            im->polyInts[local_58] =
                 (int)((float)((maxy - y2) * (ind1 - x2)) / (float)(ind2 - y2) + 0.5 + (float)x2);
            local_58 = local_58 + 1;
          }
        }
        else if (ind2 < y2) {
          ind2 = p[ints].y;
          y2 = p[fill_color].y;
          ind1 = p[ints].x;
          x2 = p[fill_color].x;
          goto LAB_0010f7b0;
        }
      }
      for (index = 1; index < local_58; index = index + 1) {
        iVar1 = im->polyInts[index];
        y = index;
        while( true ) {
          bVar2 = false;
          if (0 < y) {
            bVar2 = iVar1 < im->polyInts[y + -1];
          }
          if (!bVar2) break;
          im->polyInts[y] = im->polyInts[y + -1];
          y = y + -1;
        }
        im->polyInts[y] = iVar1;
      }
      for (index = 0; index < local_58 + -1; index = index + 2) {
        gdImageLine(im,im->polyInts[index],maxy,im->polyInts[index + 1],maxy,local_5c);
      }
    }
    if (c == -7) {
      gdImagePolygon(im,p,n,-7);
    }
  }
  else {
    ind1 = p->x;
    x2 = ind1;
    for (index = 1; index < n; index = index + 1) {
      if (p[index].x < x2) {
        x2 = p[index].x;
      }
      else if (ind1 < p[index].x) {
        ind1 = p[index].x;
      }
    }
    gdImageLine(im,x2,pmaxy,ind1,pmaxy,c);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFilledPolygon (gdImagePtr im, gdPointPtr p, int n, int c)
{
	int i;
	int j;
	int index;
	int y;
	int miny, maxy, pmaxy;
	int x1, y1;
	int x2, y2;
	int ind1, ind2;
	int ints;
	int fill_color;
	if (n <= 0) {
		return;
	}

	if (c == gdAntiAliased) {
		fill_color = im->AA_color;
	} else {
		fill_color = c;
	}
	if (!im->polyAllocated) {
		if (overflow2(sizeof (int), n)) {
			return;
		}
		im->polyInts = (int *) gdMalloc (sizeof (int) * n);
		if (!im->polyInts) {
			return;
		}
		im->polyAllocated = n;
	}
	if (im->polyAllocated < n) {
		while (im->polyAllocated < n) {
			im->polyAllocated *= 2;
		}
		if (overflow2(sizeof (int), im->polyAllocated)) {
			return;
		}
		im->polyInts = (int *) gdReallocEx (im->polyInts,
						    sizeof (int) * im->polyAllocated);
		if (!im->polyInts) {
			return;
		}
	}
	miny = p[0].y;
	maxy = p[0].y;
	for (i = 1; (i < n); i++) {
		if (p[i].y < miny) {
			miny = p[i].y;
		}
		if (p[i].y > maxy) {
			maxy = p[i].y;
		}
	}
	/* necessary special case: horizontal line */
	if (n > 1 && miny == maxy) {
		x1 = x2 = p[0].x;
		for (i = 1; (i < n); i++) {
			if (p[i].x < x1) {
				x1 = p[i].x;
			} else if (p[i].x > x2) {
				x2 = p[i].x;
			}
		}
		gdImageLine(im, x1, miny, x2, miny, c);
		return;
	}
	pmaxy = maxy;
	/* 2.0.16: Optimization by Ilia Chipitsine -- don't waste time offscreen */
	/* 2.0.26: clipping rectangle is even better */
	if (miny < im->cy1) {
		miny = im->cy1;
	}
	if (maxy > im->cy2) {
		maxy = im->cy2;
	}
	/* Fix in 1.3: count a vertex only once */
	for (y = miny; (y <= maxy); y++) {
		ints = 0;
		for (i = 0; (i < n); i++) {
			if (!i) {
				ind1 = n - 1;
				ind2 = 0;
			} else {
				ind1 = i - 1;
				ind2 = i;
			}
			y1 = p[ind1].y;
			y2 = p[ind2].y;
			if (y1 < y2) {
				x1 = p[ind1].x;
				x2 = p[ind2].x;
			} else if (y1 > y2) {
				y2 = p[ind1].y;
				y1 = p[ind2].y;
				x2 = p[ind1].x;
				x1 = p[ind2].x;
			} else {
				continue;
			}

			/* Do the following math as float intermediately, and round to ensure
			 * that Polygon and FilledPolygon for the same set of points have the
			 * same footprint. */

			if ((y >= y1) && (y < y2)) {
				im->polyInts[ints++] = (int) ((float) ((y - y1) * (x2 - x1)) /
				                              (float) (y2 - y1) + 0.5 + x1);
			} else if ((y == pmaxy) && (y == y2)) {
				im->polyInts[ints++] = x2;
			}
		}
		/*
		  2.0.26: polygons pretty much always have less than 100 points,
		  and most of the time they have considerably less. For such trivial
		  cases, insertion sort is a good choice. Also a good choice for
		  future implementations that may wish to indirect through a table.
		*/
		for (i = 1; (i < ints); i++) {
			index = im->polyInts[i];
			j = i;
			while ((j > 0) && (im->polyInts[j - 1] > index)) {
				im->polyInts[j] = im->polyInts[j - 1];
				j--;
			}
			im->polyInts[j] = index;
		}
		for (i = 0; (i < (ints-1)); i += 2) {
			/* 2.0.29: back to gdImageLine to prevent segfaults when
			  performing a pattern fill */
			gdImageLine (im, im->polyInts[i], y, im->polyInts[i + 1], y,
			             fill_color);
		}
	}
	/* If we are drawing this AA, then redraw the border with AA lines. */
	/* This doesn't work as well as I'd like, but it doesn't clash either. */
	if (c == gdAntiAliased) {
		gdImagePolygon (im, p, n, c);
	}
}